

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int priv_decode_gost(EVP_PKEY *pk,PKCS8_PRIV_KEY_INFO *p8inf)

{
  uchar *puVar1;
  int iVar2;
  BIGNUM *pBVar3;
  ASN1_OCTET_STRING *a;
  ASN1_INTEGER *a_00;
  MASKED_GOST_KEY *pMVar4;
  PKCS8_PRIV_KEY_INFO *in_RSI;
  MASKED_GOST_KEY *mgk;
  ASN1_OCTET_STRING *s;
  int expected_key_len;
  ASN1_INTEGER *priv_key;
  ASN1_OBJECT *palg_obj;
  X509_ALGOR *palg;
  int ret;
  BIGNUM *pk_num;
  int priv_len;
  uchar *p;
  uchar *pkey_buf;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  ASN1_INTEGER *in_stack_ffffffffffffff70;
  int function;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int iVar5;
  X509_ALGOR *in_stack_ffffffffffffff90;
  EVP_PKEY *in_stack_ffffffffffffff98;
  ASN1_OBJECT *local_50;
  X509_ALGOR *local_48;
  int local_3c;
  undefined8 uVar6;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar7;
  EVP_PKEY *pk_00;
  EVP_PKEY *local_20 [3];
  int local_4;
  
  local_20[0] = (EVP_PKEY *)0x0;
  iVar7 = 0;
  uVar6 = 0;
  local_3c = 0;
  local_48 = (X509_ALGOR *)0x0;
  local_50 = (ASN1_OBJECT *)0x0;
  iVar2 = PKCS8_pkey_get0(&local_50,(uchar **)local_20,(int *)&stack0xffffffffffffffd4,&local_48,
                          in_RSI);
  if (iVar2 == 0) {
    local_4 = 0;
  }
  else {
    pk_00 = local_20[0];
    iVar2 = decode_gost_algor_params(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      iVar2 = pkey_bits_gost((EVP_PKEY *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      else {
        iVar2 = pkey_bits_gost((EVP_PKEY *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        iVar2 = iVar2 / 8;
      }
      function = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      if (iVar2 == 0) {
        ERR_GOST_error(function,(int)in_stack_ffffffffffffff70,
                       (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
        local_4 = 0;
      }
      else {
        iVar5 = iVar2;
        if (iVar7 % iVar2 == 0) {
          in_stack_ffffffffffffff88 = iVar2;
          pBVar3 = (BIGNUM *)
                   unmask_priv_key(pk_00,(uchar *)CONCAT44(iVar7,in_stack_ffffffffffffffd0),
                                   (int)((ulong)uVar6 >> 0x20),(int)uVar6);
          iVar2 = in_stack_ffffffffffffff6c;
        }
        else if (*pk_00 == (EVP_PKEY)0x4) {
          a = d2i_ASN1_OCTET_STRING
                        ((ASN1_OCTET_STRING **)0x0,(uchar **)&stack0xffffffffffffffd8,(long)iVar7);
          if ((a == (ASN1_OCTET_STRING *)0x0) || ((a->length != 0x20 && (a->length != 0x40)))) {
            ASN1_STRING_free(a);
            ERR_GOST_error((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (int)in_stack_ffffffffffffff70,
                           (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
            return 0;
          }
          puVar1 = a->data;
          in_stack_ffffffffffffff84 = a->length;
          uVar6 = BN_secure_new();
          pBVar3 = (BIGNUM *)BN_lebin2bn(puVar1,in_stack_ffffffffffffff84,uVar6);
          iVar5 = iVar2;
          ASN1_STRING_free(a);
          iVar2 = in_stack_ffffffffffffff6c;
        }
        else if (*pk_00 == (EVP_PKEY)0x2) {
          a_00 = d2i_ASN1_INTEGER((ASN1_INTEGER **)0x0,(uchar **)&stack0xffffffffffffffd8,
                                  (long)iVar7);
          if (a_00 == (ASN1_INTEGER *)0x0) {
            ERR_GOST_error((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (int)in_stack_ffffffffffffff70,
                           (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
            return 0;
          }
          in_stack_ffffffffffffff70 = a_00;
          pBVar3 = (BIGNUM *)BN_secure_new();
          pBVar3 = ASN1_INTEGER_to_BN(in_stack_ffffffffffffff70,pBVar3);
          iVar5 = iVar2;
          ASN1_INTEGER_free(a_00);
          iVar2 = in_stack_ffffffffffffff6c;
        }
        else {
          if (*pk_00 != (EVP_PKEY)0x30) {
            ERR_GOST_error(function,(int)in_stack_ffffffffffffff70,
                           (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
            return 0;
          }
          pMVar4 = d2i_MASKED_GOST_KEY((MASKED_GOST_KEY **)in_stack_ffffffffffffff90,
                                       (uchar **)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                                      );
          if (pMVar4 == (MASKED_GOST_KEY *)0x0) {
            ERR_GOST_error((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (int)in_stack_ffffffffffffff70,
                           (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
            return 0;
          }
          iVar7 = pMVar4->masked_priv_key->length;
          if (iVar7 % iVar2 != 0) {
            MASKED_GOST_KEY_free((MASKED_GOST_KEY *)in_stack_ffffffffffffff70);
            ERR_GOST_error((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (int)in_stack_ffffffffffffff70,
                           (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
            return 0;
          }
          pBVar3 = (BIGNUM *)
                   unmask_priv_key(pk_00,(uchar *)CONCAT44(iVar7,in_stack_ffffffffffffffd0),
                                   (int)((ulong)uVar6 >> 0x20),(int)uVar6);
          MASKED_GOST_KEY_free((MASKED_GOST_KEY *)in_stack_ffffffffffffff70);
        }
        if (pBVar3 == (BIGNUM *)0x0) {
          ERR_GOST_error((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                         (int)in_stack_ffffffffffffff70,
                         (char *)CONCAT44(iVar2,in_stack_ffffffffffffff68),0);
          local_4 = 0;
        }
        else {
          local_3c = gost_set_priv_key((EVP_PKEY *)CONCAT44(iVar5,in_stack_ffffffffffffff88),
                                       (BIGNUM *)
                                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                                      );
          BN_free(pBVar3);
          local_4 = local_3c;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int priv_decode_gost(EVP_PKEY *pk,
                            const PKCS8_PRIV_KEY_INFO *p8inf)
{
    const unsigned char *pkey_buf = NULL, *p = NULL;
    int priv_len = 0;
    BIGNUM *pk_num = NULL;
    int ret = 0;
    const X509_ALGOR *palg = NULL;
    const ASN1_OBJECT *palg_obj = NULL;
    ASN1_INTEGER *priv_key = NULL;
    int expected_key_len;

    if (!PKCS8_pkey_get0(&palg_obj, &pkey_buf, &priv_len, &palg, p8inf))
        return 0;
    p = pkey_buf;
    if (!decode_gost_algor_params(pk, palg)) {
        return 0;
    }

    expected_key_len = pkey_bits_gost(pk) > 0 ? pkey_bits_gost(pk) / 8 : 0;
    if (expected_key_len == 0) {
        GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
        return 0;
    }

    if (priv_len % expected_key_len == 0) {
        /* Key is not wrapped but masked */
        pk_num = unmask_priv_key(pk, pkey_buf, expected_key_len,
                                 priv_len / expected_key_len - 1);
    } else if (V_ASN1_OCTET_STRING == *p) {
        /* New format - Little endian octet string */
        ASN1_OCTET_STRING *s = d2i_ASN1_OCTET_STRING(NULL, &p, priv_len);
        if (!s || ((s->length != 32) && (s->length != 64))) {
            ASN1_STRING_free(s);
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }
        pk_num = BN_lebin2bn(s->data, s->length, BN_secure_new());
        ASN1_STRING_free(s);
    } else if (V_ASN1_INTEGER == *p) {
        priv_key = d2i_ASN1_INTEGER(NULL, &p, priv_len);
        if (!priv_key) {
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }
        pk_num = ASN1_INTEGER_to_BN(priv_key, BN_secure_new());
        ASN1_INTEGER_free(priv_key);
    } else if ((V_ASN1_SEQUENCE | V_ASN1_CONSTRUCTED) == *p) {
        MASKED_GOST_KEY *mgk = d2i_MASKED_GOST_KEY(NULL, &p, priv_len);

        if (!mgk) {
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }

        priv_len = mgk->masked_priv_key->length;
        if (priv_len % expected_key_len) {
            MASKED_GOST_KEY_free(mgk);
            GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
            return 0;
        }

        pk_num = unmask_priv_key(pk, mgk->masked_priv_key->data,
                                 expected_key_len,
                                 priv_len / expected_key_len - 1);
        MASKED_GOST_KEY_free(mgk);
    } else {
        GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
        return 0;
    }

    if (pk_num == NULL) {
        GOSTerr(GOST_F_PRIV_DECODE_GOST, EVP_R_DECODE_ERROR);
        return 0;
    }

    ret = gost_set_priv_key(pk, pk_num);
    BN_free(pk_num);
    return ret;
}